

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O1

void CT_Drawer(void)

{
  uint uVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int local_4c;
  ulong local_48;
  
  if (chatmodeon != 0) {
    iVar8 = -0x1e;
    if (gamestate != GS_LEVEL) {
      iVar8 = -10;
    }
    if (viewactive) {
      iVar8 = -10;
    }
    iVar4 = active_con_scaletext();
    local_4c = 1;
    iVar11 = 1;
    if (iVar4 == 0) {
      local_4c = CleanXfac;
      iVar11 = CleanYfac;
    }
    iVar4 = active_con_scaletext();
    uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    uVar10 = (ulong)uVar1;
    if (iVar4 == 0) {
      local_48 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height;
      iVar4 = ST_Y;
    }
    else {
      iVar5 = active_con_scaletext();
      iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      uVar10 = (long)(int)uVar1 / (long)iVar5 & 0xffffffff;
      iVar6 = active_con_scaletext();
      iVar5 = ST_Y;
      local_48 = (long)iVar4 / (long)iVar6 & 0xffffffff;
      iVar4 = active_con_scaletext();
      iVar4 = iVar5 / iVar4;
    }
    iVar5 = (int)local_48;
    if ((((screen->super_DSimpleCanvas).super_DCanvas.Height != viewheight) || (viewactive == false)
        ) && (gamestate == GS_LEVEL)) {
      iVar5 = iVar4;
    }
    iVar4 = FFont::StringWidth(SmallFont,(BYTE *)"Say: ");
    iVar4 = iVar4 * local_4c;
    iVar6 = (*SmallFont->_vptr_FFont[3])(SmallFont,0x5f);
    uVar12 = (ulong)len;
    if (0 < (long)uVar12) {
      uVar13 = uVar12;
      for (iVar6 = iVar4 + iVar6 * local_4c * 2; uVar12 = uVar13, iVar6 < (int)uVar10;
          iVar6 = iVar6 + iVar7 * local_4c) {
        uVar12 = uVar13 - 1;
        iVar7 = (*SmallFont->_vptr_FFont[3])
                          (SmallFont,(ulong)((byte)(&DAT_00a2796f)[uVar13] & 0x7f));
        if ((long)uVar13 < 2) break;
        uVar13 = uVar12;
      }
    }
    iVar5 = iVar5 + iVar11 * iVar8;
    uVar13 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      uVar13 = 0;
    }
    lVar9 = (long)len;
    ChatQueue[lVar9] = SmallFont->Cursor;
    ChatQueue[lVar9 + 1] = '\0';
    iVar8 = active_con_scaletext();
    pDVar3 = screen;
    pFVar2 = SmallFont;
    if (iVar8 < 2) {
      iVar8 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,3,0,iVar5,"Say: ",0x40001393,(ulong)(iVar8 == 0),0)
      ;
      pDVar3 = screen;
      pFVar2 = SmallFont;
      iVar8 = active_con_scaletext();
      DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,2,iVar4,iVar5,(char *)(ChatQueue + uVar13),
                        0x40001393,(ulong)(iVar8 == 0),0);
    }
    else {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,3,0,iVar5,"Say: ",0x40001399,uVar10,0x4000139a,
                        local_48,0x400013a8,1,0);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,2,iVar4,iVar5,(char *)(ChatQueue + uVar13),
                        0x40001399,uVar10,0x4000139a,local_48,0x400013a8,1,0);
    }
    ChatQueue[len] = '\0';
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
  }
  lVar9 = (long)consoleplayer;
  if ((&DAT_00a39408)[lVar9 * 0x54] != 0) {
    if ((*(byte *)((&DAT_00a39408)[lVar9 * 0x54] + 0x20) & 0x20) == 0) {
      if ((((Button_ShowScores.bDown != '\0') ||
           (*(int *)((&DAT_00a39408)[lVar9 * 0x54] + 0x1cc) < 1)) || (SB_ForceActive == true)) &&
         (gamestate != GS_INTERMISSION)) {
        HU_DrawScores((player_t *)(&players + lVar9 * 0x54));
        return;
      }
    }
    else {
      (&DAT_00a39408)[lVar9 * 0x54] = 0;
    }
  }
  return;
}

Assistant:

void CT_Drawer (void)
{
	if (chatmodeon)
	{
		static const char *prompt = "Say: ";
		int i, x, scalex, y, promptwidth;

		y = (viewactive || gamestate != GS_LEVEL) ? -10 : -30;
		if (active_con_scaletext() == 0)
		{
			scalex = CleanXfac;
			y *= CleanYfac;
		}
		else
		{
			scalex = 1;
		}

		int screen_width, screen_height, st_y;
		if (active_con_scaletext() == 0)
		{
			screen_width = SCREENWIDTH;
			screen_height = SCREENHEIGHT;
			st_y = ST_Y;
		}
		else
		{
			screen_width = SCREENWIDTH / active_con_scaletext();
			screen_height = SCREENHEIGHT / active_con_scaletext();
			st_y = ST_Y / active_con_scaletext();
		}

		y += ((SCREENHEIGHT == viewheight && viewactive) || gamestate != GS_LEVEL) ? screen_height : st_y;

		promptwidth = SmallFont->StringWidth (prompt) * scalex;
		x = SmallFont->GetCharWidth ('_') * scalex * 2 + promptwidth;

		// figure out if the text is wider than the screen->
		// if so, only draw the right-most portion of it.
		for (i = len - 1; i >= 0 && x < screen_width; i--)
		{
			x += SmallFont->GetCharWidth (ChatQueue[i] & 0x7f) * scalex;
		}

		if (i >= 0)
		{
			i++;
		}
		else
		{
			i = 0;
		}

		// draw the prompt, text, and cursor
		ChatQueue[len] = SmallFont->GetCursor();
		ChatQueue[len+1] = '\0';
		if (active_con_scaletext() < 2)
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), DTA_CleanNoMove, active_con_scaletext() == 0, TAG_DONE);
		}
		else
		{
			screen->DrawText (SmallFont, CR_GREEN, 0, y, prompt, 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
			screen->DrawText (SmallFont, CR_GREY, promptwidth, y, (char *)(ChatQueue + i), 
				DTA_VirtualWidth, screen_width, DTA_VirtualHeight, screen_height, DTA_KeepRatio, true, TAG_DONE);
		}
		ChatQueue[len] = '\0';

		BorderTopRefresh = screen->GetPageCount ();
	}

	if (players[consoleplayer].camera != NULL &&
		(Button_ShowScores.bDown ||
		 players[consoleplayer].camera->health <= 0 ||
		 SB_ForceActive) &&
		 // Don't draw during intermission, since it has its own scoreboard in wi_stuff.cpp.
		 gamestate != GS_INTERMISSION)
	{
		HU_DrawScores (&players[consoleplayer]);
	}
}